

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_tset(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  cTValue *pcVar2;
  cTValue *mo;
  TValue *pTVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  GCtab *mt;
  GCobj *o_1;
  GCtab *t;
  bool bVar7;
  TValue tmp;
  
  iVar6 = 100;
  do {
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar7) {
      lj_err_msg(L,LJ_ERR_SETLOOP);
    }
    if ((o->field_2).it == 0xfffffff4) {
      uVar1 = (o->u32).lo;
      t = (GCtab *)(ulong)uVar1;
      pcVar2 = lj_tab_get(L,t,k);
      if ((pcVar2->field_2).it != 0xffffffff) {
        t->nomm = '\0';
        if ((t->marked & 4) == 0) {
          return pcVar2;
        }
        uVar5 = (ulong)(L->glref).ptr32;
        t->marked = t->marked & 0xfb;
        (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
        *(uint *)(uVar5 + 0x3c) = uVar1;
        return pcVar2;
      }
      mt = (GCtab *)(ulong)(t->metatable).gcptr32;
      if (((mt == (GCtab *)0x0) || ((mt->nomm & 2) != 0)) ||
         (mo = lj_meta_cache(mt,MM_newindex,
                             (GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x104)),
         mo == (cTValue *)0x0)) {
        t->nomm = '\0';
        if ((t->marked & 4) != 0) {
          uVar5 = (ulong)(L->glref).ptr32;
          t->marked = t->marked & 0xfb;
          (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
          *(uint *)(uVar5 + 0x3c) = uVar1;
        }
        if (pcVar2 != (cTValue *)((ulong)(L->glref).ptr32 + 0x68)) {
          return pcVar2;
        }
        if ((k->field_2).it == 0xffffffff) {
          lj_err_msg(L,LJ_ERR_NILIDX);
        }
        if (((k->field_2).it < 0xfffeffff) && (NAN(k->n))) {
          lj_err_msg(L,LJ_ERR_NANIDX);
        }
        pTVar3 = lj_tab_newkey(L,t,k);
        return pTVar3;
      }
      uVar4 = (mo->field_2).it;
    }
    else {
      mo = lj_meta_lookup(L,o,MM_newindex);
      uVar4 = (mo->field_2).it;
      if (uVar4 == 0xffffffff) {
        lj_err_optype(L,o,LJ_ERR_OPINDEX);
      }
    }
    if (uVar4 == 0xfffffff7) {
      pTVar3 = mmcall(L,lj_cont_nop,mo,o,k);
      L->top = pTVar3;
      return (TValue *)0x0;
    }
    tmp = *mo;
    o = &tmp;
  } while( true );
}

Assistant:

TValue *lj_meta_tset(lua_State *L, cTValue *o, cTValue *k)
{
  TValue tmp;
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (LJ_LIKELY(!tvisnil(tv))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	return (TValue *)tv;
      } else if (!(mo = lj_meta_fast(L, tabref(t->metatable), MM_newindex))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	if (tv != niltv(L))
	  return (TValue *)tv;
	if (tvisnil(k)) lj_err_msg(L, LJ_ERR_NILIDX);
	else if (tvisint(k)) { setnumV(&tmp, (lua_Number)intV(k)); k = &tmp; }
	else if (tvisnum(k) && tvisnan(k)) lj_err_msg(L, LJ_ERR_NANIDX);
	return lj_tab_newkey(L, t, k);
      }
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_newindex))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_nop, mo, o, k);
      /* L->top+2 = v filled in by caller. */
      return NULL;  /* Trigger metamethod call. */
    }
    copyTV(L, &tmp, mo);
    o = &tmp;
  }
  lj_err_msg(L, LJ_ERR_SETLOOP);
  return NULL;  /* unreachable */
}